

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O0

void __thiscall BufferPool_SmallBuffers_Test::TestBody(BufferPool_SmallBuffers_Test *this)

{
  BufferPool *this_00;
  void *pvVar1;
  void *__ptr;
  BufferPool *local_190;
  ulong local_150;
  size_t i_1;
  void *c;
  void *b;
  void *a;
  BufferPool *pool;
  size_t i;
  BufferPool local_108 [4];
  BufferPool local_48;
  BufferPool_SmallBuffers_Test *local_10;
  BufferPool_SmallBuffers_Test *this_local;
  
  local_10 = this;
  memt::BufferPool::BufferPool(local_108,1);
  memt::BufferPool::BufferPool(local_108 + 1,2);
  memt::BufferPool::BufferPool(local_108 + 2,3);
  memt::BufferPool::BufferPool(local_108 + 3,4);
  memt::BufferPool::BufferPool(&local_48,5);
  for (pool = (BufferPool *)0x0; pool < (BufferPool *)0x5;
      pool = (BufferPool *)((long)&pool->_bufferSize + 1)) {
    this_00 = local_108 + (long)pool;
    pvVar1 = memt::BufferPool::alloc(this_00);
    memt::BufferPool::free(this_00,pvVar1);
    pvVar1 = memt::BufferPool::alloc(this_00);
    __ptr = memt::BufferPool::alloc(this_00);
    memt::BufferPool::alloc(this_00);
    memt::BufferPool::free(this_00,__ptr);
    for (local_150 = 0; local_150 < 10000; local_150 = local_150 + 1) {
      memt::BufferPool::alloc(this_00);
    }
    memt::BufferPool::free(this_00,pvVar1);
  }
  local_190 = (BufferPool *)&stack0xffffffffffffffe8;
  do {
    local_190 = local_190 + -1;
    memt::BufferPool::~BufferPool(local_190);
  } while (local_190 != local_108);
  return;
}

Assistant:

TEST(BufferPool, SmallBuffers) {
  memt::BufferPool pools[] = {1, 2, 3, 4, 5};
  for (size_t i = 0; i < sizeof(pools) / sizeof(memt::BufferPool); ++i) {
    memt::BufferPool& pool = pools[i];
    void* a = pool.alloc();
    pool.free(a);
    void* b = pool.alloc();
    void* c = pool.alloc();
    pool.alloc();
    pool.free(c);
    for (size_t i = 0; i < 10000; ++i)
      pool.alloc();
    pool.free(b);
  }
}